

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O1

size_t ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  BYTE *pBVar3;
  long *plVar4;
  ulong *iEnd;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  BYTE *pBVar8;
  ZSTD_matchState_t *pZVar9;
  ulong *mEnd;
  BYTE *pBVar10;
  U32 *pUVar11;
  U32 *pUVar12;
  U32 *pUVar13;
  U32 *pUVar14;
  long lVar15;
  seqDef *psVar16;
  long lVar17;
  bool bVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  U32 UVar22;
  uint uVar23;
  BYTE *op_1;
  ulong *puVar24;
  seqDef **ppsVar25;
  size_t sVar26;
  BYTE *pBVar27;
  int *piVar28;
  int *piVar29;
  long *plVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  U32 UVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  long *plVar38;
  ulong *puVar39;
  long *plVar40;
  uint uVar41;
  BYTE *ip;
  int *iStart;
  ulong *puVar42;
  ulong *puVar43;
  uint uVar44;
  ulong uVar45;
  int *piVar46;
  ulong uVar47;
  ulong uVar48;
  int iVar49;
  BYTE *pBVar50;
  ulong uVar51;
  BYTE *unaff_R15;
  U32 prefixLowestIndex;
  BYTE *ilimit;
  BYTE *base;
  BYTE *iend;
  BYTE *prefixLowest;
  BYTE *pInLoopLimit;
  U32 dictStartIndex;
  U32 dictIndexDelta;
  BYTE *dictBase;
  BYTE *dictEnd;
  BYTE *dictStart;
  U32 *hashLong;
  U32 *hashSmall;
  U32 *dictHashLong;
  U32 *dictHashSmall;
  long *local_150;
  U32 local_134;
  BYTE *local_128;
  U32 local_10c;
  BYTE *local_108;
  BYTE *local_f8;
  BYTE *local_f0;
  
  pBVar8 = (ms->window).base;
  uVar5 = (ms->window).dictLimit;
  iStart = (int *)(pBVar8 + uVar5);
  pZVar9 = ms->dictMatchState;
  uVar6 = (pZVar9->window).dictLimit;
  mEnd = (ulong *)(pZVar9->window).nextSrc;
  pBVar10 = (pZVar9->window).base;
  piVar46 = (int *)(pBVar10 + uVar6);
  uVar41 = ((int)pBVar10 - (int)mEnd) + uVar5;
  pBVar50 = (BYTE *)(ulong)uVar41;
  iEnd = (ulong *)((long)src + srcSize);
  plVar4 = (long *)((long)src + (srcSize - 8));
  local_150 = (long *)((ulong)(((int)src - (int)iStart) + (int)mEnd == (int)piVar46) + (long)src);
  uVar7 = (ms->cParams).minMatch;
  pUVar11 = ms->hashTable;
  pUVar12 = ms->chainTable;
  local_134 = *rep;
  local_10c = rep[1];
  pUVar13 = pZVar9->hashTable;
  pUVar14 = pZVar9->chainTable;
  iVar49 = (int)pBVar8;
  if (uVar7 == 5) {
    if (local_150 < plVar4) {
      bVar31 = 0x40 - (char)(ms->cParams).hashLog;
      bVar32 = 0x40 - (char)(ms->cParams).chainLog;
      bVar33 = 0x40 - (char)(pZVar9->cParams).hashLog;
      uVar7 = (pZVar9->cParams).chainLog;
      puVar1 = (ulong *)((long)iEnd + -7);
      puVar2 = (ulong *)((long)iEnd + -3);
      puVar24 = (ulong *)((long)iEnd + -1);
      ppsVar25 = &seqStore->sequences;
      lVar15 = -(long)pBVar50;
      pBVar3 = pBVar8 + -1;
      local_108 = pBVar3;
      do {
        lVar17 = *local_150;
        uVar45 = (ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar31 & 0x3f);
        uVar47 = (ulong)(lVar17 * -0x30e4432345000000) >> (bVar32 & 0x3f);
        uVar51 = (long)local_150 - (long)pBVar8;
        uVar23 = pUVar11[uVar45];
        UVar22 = (U32)uVar51;
        UVar34 = UVar22 + 1;
        uVar35 = UVar34 - local_134;
        piVar28 = (int *)(pBVar8 + uVar35);
        if (uVar35 < uVar5) {
          piVar28 = (int *)(pBVar10 + (uVar35 - uVar41));
        }
        uVar36 = pUVar12[uVar47];
        pUVar12[uVar47] = UVar22;
        pUVar11[uVar45] = UVar22;
        if ((uVar35 - uVar5 < 0xfffffffd) && (*piVar28 == *(int *)((long)local_150 + 1))) {
          puVar43 = iEnd;
          if (uVar35 < uVar5) {
            puVar43 = mEnd;
          }
          sVar26 = ZSTD_count_2segments
                             ((BYTE *)((long)local_150 + 5),(BYTE *)(piVar28 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar43,(BYTE *)iStart);
          uVar45 = ((long)local_150 + 1) - (long)src;
          plVar30 = (long *)seqStore->lit;
          plVar38 = (long *)((long)plVar30 + uVar45);
          do {
            *plVar30 = *src;
            plVar30 = plVar30 + 1;
            src = (void *)((long)src + 8);
          } while (plVar30 < plVar38);
          seqStore->lit = seqStore->lit + uVar45;
          if (0xffff < uVar45) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          pBVar50 = (BYTE *)(sVar26 + 4);
          pBVar27 = (BYTE *)(sVar26 + 1);
          psVar16 = *ppsVar25;
          psVar16->litLength = (U16)uVar45;
          psVar16->offset = 1;
          local_150 = (long *)((long)local_150 + 1);
          UVar34 = local_134;
joined_r0x00485110:
          local_134 = UVar34;
          if ((BYTE *)0xffff < pBVar27) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar16->matchLength = (U16)pBVar27;
          *ppsVar25 = psVar16 + 1;
          src = (void *)((long)local_150 + (long)pBVar50);
          local_150 = (long *)src;
          if (src <= plVar4) {
            lVar17 = *(long *)(pBVar8 + (uVar51 & 0xffffffff) + 2);
            pUVar12[(ulong)(lVar17 * -0x30e4432345000000) >> (bVar32 & 0x3f)] = UVar22 + 2;
            pUVar11[(ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar31 & 0x3f)] = UVar22 + 2;
            lVar17 = *(long *)((long)src + -2);
            UVar22 = ((int)src + -2) - iVar49;
            pUVar12[(ulong)(lVar17 * -0x30e4432345000000) >> (bVar32 & 0x3f)] = UVar22;
            pUVar11[(ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar31 & 0x3f)] = UVar22;
            do {
              local_150 = (long *)src;
              if (plVar4 < src) break;
              UVar22 = (int)src - iVar49;
              uVar23 = UVar22 - local_10c;
              pBVar27 = pBVar8;
              if (uVar23 < uVar5) {
                pBVar27 = pBVar10 + lVar15;
              }
              if ((uVar23 - uVar5 < 0xfffffffd) && (*(int *)(pBVar27 + uVar23) == (int)*src)) {
                puVar43 = iEnd;
                if (uVar23 < uVar5) {
                  puVar43 = mEnd;
                }
                sVar26 = ZSTD_count_2segments
                                   ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar27 + uVar23) + 4),
                                    (BYTE *)iEnd,(BYTE *)puVar43,(BYTE *)iStart);
                *(long *)seqStore->lit = *src;
                psVar16 = seqStore->sequences;
                psVar16->litLength = 0;
                psVar16->offset = 1;
                if (0xffff < sVar26 + 1) {
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar16->matchLength = (U16)(sVar26 + 1);
                seqStore->sequences = psVar16 + 1;
                lVar17 = *src;
                pUVar12[(ulong)(lVar17 * -0x30e4432345000000) >> (bVar32 & 0x3f)] = UVar22;
                pUVar11[(ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar31 & 0x3f)] = UVar22;
                src = (void *)((long)src + sVar26 + 4);
                bVar18 = true;
                UVar22 = local_134;
                local_134 = local_10c;
              }
              else {
                bVar18 = false;
                UVar22 = local_10c;
              }
              local_10c = UVar22;
              local_150 = (long *)src;
            } while (bVar18);
          }
        }
        else {
          if (uVar5 < uVar23) {
            plVar38 = (long *)(pBVar8 + uVar23);
            if (*plVar38 == lVar17) {
              puVar39 = (ulong *)(local_150 + 1);
              puVar43 = (ulong *)(plVar38 + 1);
              puVar42 = puVar39;
              if (puVar39 < puVar1) {
                uVar47 = *puVar39 ^ *puVar43;
                uVar45 = 0;
                if (uVar47 != 0) {
                  for (; (uVar47 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                  }
                }
                pBVar50 = (BYTE *)(uVar45 >> 3 & 0x1fffffff);
                if (*puVar43 == *puVar39) {
                  puVar42 = (ulong *)(local_150 + 2);
                  puVar43 = (ulong *)(plVar38 + 2);
                  do {
                    if (puVar1 <= puVar42) goto LAB_004852be;
                    uVar45 = *puVar43;
                    uVar47 = *puVar42;
                    uVar48 = uVar47 ^ uVar45;
                    uVar19 = 0;
                    if (uVar48 != 0) {
                      for (; (uVar48 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                      }
                    }
                    pBVar50 = (BYTE *)((long)puVar42 + ((uVar19 >> 3 & 0x1fffffff) - (long)puVar39))
                    ;
                    puVar42 = puVar42 + 1;
                    puVar43 = puVar43 + 1;
                  } while (uVar45 == uVar47);
                }
              }
              else {
LAB_004852be:
                if ((puVar42 < puVar2) && ((int)*puVar43 == (int)*puVar42)) {
                  puVar42 = (ulong *)((long)puVar42 + 4);
                  puVar43 = (ulong *)((long)puVar43 + 4);
                }
                if ((puVar42 < puVar24) && ((short)*puVar43 == (short)*puVar42)) {
                  puVar42 = (ulong *)((long)puVar42 + 2);
                  puVar43 = (ulong *)((long)puVar43 + 2);
                }
                if (puVar42 < iEnd) {
                  puVar42 = (ulong *)((long)puVar42 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar42));
                }
                pBVar50 = (BYTE *)((long)puVar42 - (long)puVar39);
              }
              pBVar50 = pBVar50 + 8;
              local_108 = (BYTE *)(ulong)(uint)((int)local_150 - (int)plVar38);
              if ((uVar23 <= uVar5) || (local_150 <= src)) goto LAB_004858da;
              piVar28 = (int *)(pBVar3 + uVar23);
              local_150 = (long *)((long)local_150 + -1);
              while (plVar38 = local_150, (BYTE)*local_150 == (BYTE)*piVar28) {
                pBVar50 = pBVar50 + 1;
                plVar38 = (long *)((long)local_150 + -1);
                if ((piVar28 <= iStart) ||
                   (piVar28 = (int *)((long)piVar28 + -1), bVar18 = local_150 <= src,
                   local_150 = plVar38, bVar18)) break;
              }
              goto LAB_004858d7;
            }
LAB_004853b1:
            if (uVar5 < uVar36) {
              piVar28 = (int *)(pBVar8 + uVar36);
              if (*piVar28 != (int)*local_150) {
LAB_0048540f:
                local_150 = (long *)((long)local_150 + ((long)local_150 - (long)src >> 8) + 1);
                goto LAB_00485b77;
              }
            }
            else {
              uVar36 = pUVar14[(ulong)(lVar17 * -0x30e4432345000000) >> (0x40U - (char)uVar7 & 0x3f)
                              ];
              piVar28 = (int *)(pBVar10 + uVar36);
              if ((uVar36 <= uVar6) || (iVar21 = 10, *piVar28 != (int)*local_150)) {
                iVar21 = 0;
              }
              if (iVar21 != 10) {
                if (iVar21 != 0) goto LAB_00485b77;
                goto LAB_0048540f;
              }
              uVar36 = uVar36 + uVar41;
            }
            lVar17 = *(long *)((long)local_150 + 1);
            uVar45 = (ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar31 & 0x3f);
            plVar38 = (long *)((long)local_150 + 1);
            uVar23 = pUVar11[uVar45];
            pUVar11[uVar45] = UVar34;
            if (uVar5 < uVar23) {
              plVar30 = (long *)(pBVar8 + uVar23);
              if (*plVar30 == lVar17) {
                puVar39 = (ulong *)((long)local_150 + 9);
                puVar43 = (ulong *)(plVar30 + 1);
                puVar42 = puVar39;
                if (puVar39 < puVar1) {
                  uVar47 = *puVar39 ^ *puVar43;
                  uVar45 = 0;
                  if (uVar47 != 0) {
                    for (; (uVar47 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                    }
                  }
                  pBVar50 = (BYTE *)(uVar45 >> 3 & 0x1fffffff);
                  if (*puVar43 == *puVar39) {
                    puVar42 = (ulong *)((long)local_150 + 0x11);
                    puVar43 = (ulong *)(plVar30 + 2);
                    do {
                      if (puVar1 <= puVar42) goto LAB_00485764;
                      uVar45 = *puVar43;
                      uVar47 = *puVar42;
                      uVar48 = uVar47 ^ uVar45;
                      uVar19 = 0;
                      if (uVar48 != 0) {
                        for (; (uVar48 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                        }
                      }
                      pBVar50 = (BYTE *)((long)puVar42 +
                                        ((uVar19 >> 3 & 0x1fffffff) - (long)puVar39));
                      puVar42 = puVar42 + 1;
                      puVar43 = puVar43 + 1;
                    } while (uVar45 == uVar47);
                  }
                }
                else {
LAB_00485764:
                  if ((puVar42 < puVar2) && ((int)*puVar43 == (int)*puVar42)) {
                    puVar42 = (ulong *)((long)puVar42 + 4);
                    puVar43 = (ulong *)((long)puVar43 + 4);
                  }
                  if ((puVar42 < puVar24) && ((short)*puVar43 == (short)*puVar42)) {
                    puVar42 = (ulong *)((long)puVar42 + 2);
                    puVar43 = (ulong *)((long)puVar43 + 2);
                  }
                  if (puVar42 < iEnd) {
                    puVar42 = (ulong *)((long)puVar42 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar42));
                  }
                  pBVar50 = (BYTE *)((long)puVar42 - (long)puVar39);
                }
                pBVar50 = pBVar50 + 8;
                uVar35 = (int)plVar38 - (int)plVar30;
                iVar21 = 7;
                if ((uVar5 < uVar23) && (src < plVar38)) {
                  piVar29 = (int *)(pBVar3 + uVar23);
                  plVar30 = local_150;
                  while (local_150 = plVar30, (BYTE)*local_150 == (BYTE)*piVar29) {
                    pBVar50 = pBVar50 + 1;
                    plVar38 = local_150;
                    if ((piVar29 <= iStart) ||
                       (piVar29 = (int *)((long)piVar29 + -1),
                       plVar30 = (long *)((long)local_150 + -1), local_150 <= src))
                    goto LAB_0048560d;
                  }
                  plVar38 = (long *)((long)local_150 + 1);
                }
              }
              else {
LAB_004855fc:
                iVar21 = 0;
                uVar35 = (uint)local_108;
                plVar38 = local_150;
              }
            }
            else {
              uVar23 = pUVar13[(ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar33 & 0x3f)];
              if ((uVar23 <= uVar6) || (*(long *)(pBVar10 + uVar23) != lVar17)) goto LAB_004855fc;
              sVar26 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_150 + 9),
                                  (BYTE *)((long)(pBVar10 + uVar23) + 8),(BYTE *)iEnd,(BYTE *)mEnd,
                                  (BYTE *)iStart);
              pBVar50 = (BYTE *)(sVar26 + 8);
              uVar35 = UVar34 - (uVar41 + uVar23);
              iVar21 = 7;
              iVar20 = 7;
              if ((uVar6 < uVar23) && (iVar21 = iVar20, src < plVar38)) {
                piVar29 = (int *)(pBVar10 + ((ulong)uVar23 - 1));
                while ((BYTE)*local_150 == (BYTE)*piVar29) {
                  pBVar50 = pBVar50 + 1;
                  plVar38 = local_150;
                  if ((piVar29 <= piVar46) ||
                     (piVar29 = (int *)((long)piVar29 + -1), bVar18 = local_150 <= src,
                     local_150 = (long *)((long)local_150 + -1), bVar18)) goto LAB_0048560d;
                }
                plVar38 = (long *)((long)local_150 + 1);
              }
            }
LAB_0048560d:
            local_150 = plVar38;
            if (iVar21 == 7) {
              local_108 = (BYTE *)(ulong)uVar35;
              goto LAB_004858da;
            }
            if (iVar21 != 0) {
              local_108 = (BYTE *)(ulong)uVar35;
              goto LAB_00485b77;
            }
            puVar43 = (ulong *)((long)local_150 + 4);
            puVar42 = (ulong *)(piVar28 + 1);
            if (uVar36 < uVar5) {
              sVar26 = ZSTD_count_2segments
                                 ((BYTE *)puVar43,(BYTE *)puVar42,(BYTE *)iEnd,(BYTE *)mEnd,
                                  (BYTE *)iStart);
              pBVar50 = (BYTE *)(sVar26 + 4);
              local_108 = (BYTE *)(ulong)(UVar22 - uVar36);
              if ((piVar46 < piVar28) && (src < local_150)) {
                local_150 = (long *)((long)local_150 + -1);
                while (piVar28 = (int *)((long)piVar28 + -1), plVar38 = local_150,
                      (BYTE)*local_150 == *(BYTE *)piVar28) {
                  pBVar50 = pBVar50 + 1;
                  plVar38 = (long *)((long)local_150 + -1);
                  if ((piVar28 <= piVar46) ||
                     (bVar18 = local_150 <= src, local_150 = plVar38, bVar18)) break;
                }
                goto LAB_004858d7;
              }
            }
            else {
              puVar39 = puVar43;
              if (puVar43 < puVar1) {
                uVar47 = *puVar43 ^ *puVar42;
                uVar45 = 0;
                if (uVar47 != 0) {
                  for (; (uVar47 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                  }
                }
                pBVar50 = (BYTE *)(uVar45 >> 3 & 0x1fffffff);
                if (*puVar42 == *puVar43) {
                  puVar39 = (ulong *)((long)local_150 + 0xc);
                  puVar42 = (ulong *)(piVar28 + 3);
                  do {
                    if (puVar1 <= puVar39) goto LAB_00485825;
                    uVar45 = *puVar42;
                    uVar47 = *puVar39;
                    uVar48 = uVar47 ^ uVar45;
                    uVar19 = 0;
                    if (uVar48 != 0) {
                      for (; (uVar48 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                      }
                    }
                    pBVar50 = (BYTE *)((long)puVar39 + ((uVar19 >> 3 & 0x1fffffff) - (long)puVar43))
                    ;
                    puVar39 = puVar39 + 1;
                    puVar42 = puVar42 + 1;
                  } while (uVar45 == uVar47);
                }
              }
              else {
LAB_00485825:
                if ((puVar39 < puVar2) && ((int)*puVar42 == (int)*puVar39)) {
                  puVar39 = (ulong *)((long)puVar39 + 4);
                  puVar42 = (ulong *)((long)puVar42 + 4);
                }
                if ((puVar39 < puVar24) && ((short)*puVar42 == (short)*puVar39)) {
                  puVar39 = (ulong *)((long)puVar39 + 2);
                  puVar42 = (ulong *)((long)puVar42 + 2);
                }
                if (puVar39 < iEnd) {
                  puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar39));
                }
                pBVar50 = (BYTE *)((long)puVar39 - (long)puVar43);
              }
              pBVar50 = pBVar50 + 4;
              local_108 = (BYTE *)(ulong)(uint)((int)local_150 - (int)piVar28);
              if ((iStart < piVar28) && (src < local_150)) {
                local_150 = (long *)((long)local_150 + -1);
                while (piVar28 = (int *)((long)piVar28 + -1), plVar38 = local_150,
                      (BYTE)*local_150 == *(BYTE *)piVar28) {
                  pBVar50 = pBVar50 + 1;
                  plVar38 = (long *)((long)local_150 + -1);
                  if ((piVar28 <= iStart) ||
                     (bVar18 = local_150 <= src, local_150 = plVar38, bVar18)) break;
                }
LAB_004858d7:
                local_150 = (long *)((long)plVar38 + 1);
              }
            }
LAB_004858da:
            uVar45 = (long)local_150 - (long)src;
            plVar30 = (long *)seqStore->lit;
            plVar38 = (long *)((long)plVar30 + uVar45);
            do {
              *plVar30 = *src;
              plVar30 = plVar30 + 1;
              src = (void *)((long)src + 8);
            } while (plVar30 < plVar38);
            seqStore->lit = seqStore->lit + uVar45;
            if (0xffff < uVar45) {
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            pBVar27 = pBVar50 + -3;
            psVar16 = *ppsVar25;
            psVar16->litLength = (U16)uVar45;
            psVar16->offset = (U32)local_108 + 3;
            UVar34 = (U32)local_108;
            local_10c = local_134;
            goto joined_r0x00485110;
          }
          uVar23 = pUVar13[(ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar33 & 0x3f)];
          iVar21 = 0;
          if ((uVar6 < uVar23) && (*(long *)(pBVar10 + uVar23) == lVar17)) {
            sVar26 = ZSTD_count_2segments
                               ((BYTE *)(local_150 + 1),(BYTE *)((long)(pBVar10 + uVar23) + 8),
                                (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
            pBVar50 = (BYTE *)(sVar26 + 8);
            local_108 = (BYTE *)(ulong)(UVar22 - (uVar41 + uVar23));
            iVar20 = 7;
            iVar21 = 7;
            if ((uVar6 < uVar23) && (iVar21 = iVar20, src < local_150)) {
              piVar28 = (int *)(pBVar10 + ((ulong)uVar23 - 1));
              do {
                plVar38 = (long *)((long)local_150 + -1);
                if ((*(BYTE *)plVar38 != (BYTE)*piVar28) ||
                   (pBVar50 = pBVar50 + 1, local_150 = plVar38, piVar28 <= piVar46)) break;
                piVar28 = (int *)((long)piVar28 + -1);
              } while (src < plVar38);
            }
          }
          if (iVar21 == 7) goto LAB_004858da;
          if (iVar21 == 0) goto LAB_004853b1;
        }
LAB_00485b77:
      } while (local_150 < plVar4);
    }
  }
  else if (uVar7 == 6) {
    if (local_150 < plVar4) {
      bVar31 = 0x40 - (char)(ms->cParams).hashLog;
      bVar32 = 0x40 - (char)(ms->cParams).chainLog;
      bVar33 = 0x40 - (char)(pZVar9->cParams).hashLog;
      uVar7 = (pZVar9->cParams).chainLog;
      puVar1 = (ulong *)((long)iEnd + -7);
      puVar2 = (ulong *)((long)iEnd + -3);
      puVar24 = (ulong *)((long)iEnd + -1);
      ppsVar25 = &seqStore->sequences;
      lVar15 = -(long)pBVar50;
      pBVar3 = pBVar8 + -1;
      local_f8 = pBVar3;
LAB_004842ac:
      lVar17 = *local_150;
      uVar45 = (ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar31 & 0x3f);
      uVar47 = (ulong)(lVar17 * -0x30e4432340650000) >> (bVar32 & 0x3f);
      uVar51 = (long)local_150 - (long)pBVar8;
      uVar23 = pUVar11[uVar45];
      UVar22 = (U32)uVar51;
      UVar34 = UVar22 + 1;
      uVar35 = UVar34 - local_134;
      piVar28 = (int *)(pBVar8 + uVar35);
      if (uVar35 < uVar5) {
        piVar28 = (int *)(pBVar10 + (uVar35 - uVar41));
      }
      uVar36 = pUVar12[uVar47];
      pUVar12[uVar47] = UVar22;
      pUVar11[uVar45] = UVar22;
      if ((uVar35 - uVar5 < 0xfffffffd) && (*piVar28 == *(int *)((long)local_150 + 1))) {
        puVar43 = iEnd;
        if (uVar35 < uVar5) {
          puVar43 = mEnd;
        }
        sVar26 = ZSTD_count_2segments
                           ((BYTE *)((long)local_150 + 5),(BYTE *)(piVar28 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar43,(BYTE *)iStart);
        uVar45 = ((long)local_150 + 1) - (long)src;
        plVar30 = (long *)seqStore->lit;
        plVar38 = (long *)((long)plVar30 + uVar45);
        do {
          *plVar30 = *src;
          plVar30 = plVar30 + 1;
          src = (void *)((long)src + 8);
        } while (plVar30 < plVar38);
        seqStore->lit = seqStore->lit + uVar45;
        if (0xffff < uVar45) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        pBVar50 = (BYTE *)(sVar26 + 4);
        pBVar27 = (BYTE *)(sVar26 + 1);
        psVar16 = *ppsVar25;
        psVar16->litLength = (U16)uVar45;
        psVar16->offset = 1;
        local_150 = (long *)((long)local_150 + 1);
        UVar34 = local_134;
        goto joined_r0x00484440;
      }
      if (uVar5 < uVar23) {
        plVar38 = (long *)(pBVar8 + uVar23);
        plVar30 = local_150;
        if (*plVar38 == lVar17) {
          puVar43 = (ulong *)(local_150 + 1);
          puVar39 = (ulong *)(plVar38 + 1);
          puVar42 = puVar43;
          if (puVar43 < puVar1) {
            uVar47 = *puVar43 ^ *puVar39;
            uVar45 = 0;
            if (uVar47 != 0) {
              for (; (uVar47 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
              }
            }
            pBVar50 = (BYTE *)(uVar45 >> 3 & 0x1fffffff);
            if (*puVar39 == *puVar43) {
              puVar42 = (ulong *)(local_150 + 2);
              puVar39 = (ulong *)(plVar38 + 2);
              do {
                if (puVar1 <= puVar42) goto LAB_004845de;
                uVar45 = *puVar39;
                uVar47 = *puVar42;
                uVar48 = uVar47 ^ uVar45;
                uVar19 = 0;
                if (uVar48 != 0) {
                  for (; (uVar48 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                  }
                }
                pBVar50 = (BYTE *)((long)puVar42 + ((uVar19 >> 3 & 0x1fffffff) - (long)puVar43));
                puVar42 = puVar42 + 1;
                puVar39 = puVar39 + 1;
              } while (uVar45 == uVar47);
            }
          }
          else {
LAB_004845de:
            if ((puVar42 < puVar2) && ((int)*puVar39 == (int)*puVar42)) {
              puVar42 = (ulong *)((long)puVar42 + 4);
              puVar39 = (ulong *)((long)puVar39 + 4);
            }
            if ((puVar42 < puVar24) && ((short)*puVar39 == (short)*puVar42)) {
              puVar42 = (ulong *)((long)puVar42 + 2);
              puVar39 = (ulong *)((long)puVar39 + 2);
            }
            if (puVar42 < iEnd) {
              puVar42 = (ulong *)((long)puVar42 + (ulong)((BYTE)*puVar39 == (BYTE)*puVar42));
            }
            pBVar50 = (BYTE *)((long)puVar42 - (long)puVar43);
          }
          pBVar50 = pBVar50 + 8;
          local_f8 = (BYTE *)(ulong)(uint)((int)local_150 - (int)plVar38);
          if ((uVar23 <= uVar5) || (local_150 <= src)) goto LAB_00484bb7;
          piVar28 = (int *)(pBVar3 + uVar23);
          plVar38 = (long *)((long)local_150 + -1);
          do {
            if ((BYTE)*plVar38 != (BYTE)*piVar28) goto LAB_00484bb1;
            pBVar50 = pBVar50 + 1;
            local_150 = (long *)((long)plVar38 + -1);
          } while ((iStart < piVar28) &&
                  (piVar28 = (int *)((long)piVar28 + -1), bVar18 = src < plVar38,
                  plVar38 = local_150, bVar18));
          goto LAB_00484689;
        }
LAB_004846bc:
        if (uVar5 < uVar36) {
          piVar28 = (int *)(pBVar8 + uVar36);
          if (*piVar28 != (int)*plVar30) {
LAB_00484718:
            local_150 = (long *)((long)plVar30 + ((long)plVar30 - (long)src >> 8) + 1);
            goto LAB_00484e51;
          }
        }
        else {
          uVar36 = pUVar14[(ulong)(lVar17 * -0x30e4432340650000) >> (0x40U - (char)uVar7 & 0x3f)];
          piVar28 = (int *)(pBVar10 + uVar36);
          if ((uVar36 <= uVar6) || (iVar21 = 10, *piVar28 != (int)*plVar30)) {
            iVar21 = 0;
          }
          if (iVar21 != 10) {
            local_150 = plVar30;
            if (iVar21 != 0) goto LAB_00484e51;
            goto LAB_00484718;
          }
          uVar36 = uVar41 + uVar36;
        }
        lVar17 = *(long *)((long)plVar30 + 1);
        uVar45 = (ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar31 & 0x3f);
        local_150 = (long *)((long)plVar30 + 1);
        uVar23 = pUVar11[uVar45];
        pUVar11[uVar45] = UVar34;
        if (uVar5 < uVar23) {
          plVar38 = (long *)(pBVar8 + uVar23);
          if (*plVar38 == lVar17) {
            puVar43 = (ulong *)((long)plVar30 + 9);
            puVar39 = (ulong *)(plVar38 + 1);
            puVar42 = puVar43;
            if (puVar43 < puVar1) {
              uVar47 = *puVar43 ^ *puVar39;
              uVar45 = 0;
              if (uVar47 != 0) {
                for (; (uVar47 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                }
              }
              pBVar50 = (BYTE *)(uVar45 >> 3 & 0x1fffffff);
              if (*puVar39 == *puVar43) {
                puVar42 = (ulong *)((long)plVar30 + 0x11);
                puVar39 = (ulong *)(plVar38 + 2);
                do {
                  if (puVar1 <= puVar42) goto LAB_00484a5d;
                  uVar45 = *puVar39;
                  uVar47 = *puVar42;
                  uVar48 = uVar47 ^ uVar45;
                  uVar19 = 0;
                  if (uVar48 != 0) {
                    for (; (uVar48 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  pBVar50 = (BYTE *)((long)puVar42 + ((uVar19 >> 3 & 0x1fffffff) - (long)puVar43));
                  puVar42 = puVar42 + 1;
                  puVar39 = puVar39 + 1;
                } while (uVar45 == uVar47);
              }
            }
            else {
LAB_00484a5d:
              if ((puVar42 < puVar2) && ((int)*puVar39 == (int)*puVar42)) {
                puVar42 = (ulong *)((long)puVar42 + 4);
                puVar39 = (ulong *)((long)puVar39 + 4);
              }
              if ((puVar42 < puVar24) && ((short)*puVar39 == (short)*puVar42)) {
                puVar42 = (ulong *)((long)puVar42 + 2);
                puVar39 = (ulong *)((long)puVar39 + 2);
              }
              if (puVar42 < iEnd) {
                puVar42 = (ulong *)((long)puVar42 + (ulong)((BYTE)*puVar39 == (BYTE)*puVar42));
              }
              pBVar50 = (BYTE *)((long)puVar42 - (long)puVar43);
            }
            pBVar50 = pBVar50 + 8;
            uVar35 = (int)local_150 - (int)plVar38;
            iVar21 = 7;
            if ((uVar5 < uVar23) && (src < local_150)) {
              piVar29 = (int *)(pBVar3 + uVar23);
              while (local_150 = plVar30, (BYTE)*local_150 == (BYTE)*piVar29) {
                pBVar50 = pBVar50 + 1;
                if ((piVar29 <= iStart) ||
                   (piVar29 = (int *)((long)piVar29 + -1), plVar30 = (long *)((long)local_150 + -1),
                   local_150 <= src)) goto LAB_00484906;
              }
              local_150 = (long *)((long)local_150 + 1);
            }
          }
          else {
LAB_004848f4:
            iVar21 = 0;
            uVar35 = (uint)local_f8;
            local_150 = plVar30;
          }
        }
        else {
          uVar23 = pUVar13[(ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar33 & 0x3f)];
          if ((uVar23 <= uVar6) || (*(long *)(pBVar10 + uVar23) != lVar17)) goto LAB_004848f4;
          sVar26 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar30 + 9),(BYTE *)((long)(pBVar10 + uVar23) + 8),
                              (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
          pBVar50 = (BYTE *)(sVar26 + 8);
          uVar35 = UVar34 - (uVar41 + uVar23);
          iVar21 = 7;
          iVar20 = 7;
          if ((uVar6 < uVar23) && (iVar21 = iVar20, src < local_150)) {
            piVar29 = (int *)(pBVar10 + ((ulong)uVar23 - 1));
            while ((BYTE)*plVar30 == (BYTE)*piVar29) {
              pBVar50 = pBVar50 + 1;
              local_150 = plVar30;
              if ((piVar29 <= piVar46) ||
                 (piVar29 = (int *)((long)piVar29 + -1), bVar18 = plVar30 <= src,
                 plVar30 = (long *)((long)plVar30 + -1), bVar18)) goto LAB_00484906;
            }
            local_150 = (long *)((long)plVar30 + 1);
          }
        }
LAB_00484906:
        if (iVar21 == 7) {
          local_f8 = (BYTE *)(ulong)uVar35;
          goto LAB_00484bb7;
        }
        if (iVar21 != 0) {
          local_f8 = (BYTE *)(ulong)uVar35;
          goto LAB_00484e51;
        }
        puVar43 = (ulong *)((long)local_150 + 4);
        puVar42 = (ulong *)(piVar28 + 1);
        if (uVar36 < uVar5) {
          sVar26 = ZSTD_count_2segments
                             ((BYTE *)puVar43,(BYTE *)puVar42,(BYTE *)iEnd,(BYTE *)mEnd,
                              (BYTE *)iStart);
          pBVar50 = (BYTE *)(sVar26 + 4);
          local_f8 = (BYTE *)(ulong)(UVar22 - uVar36);
          if ((piVar46 < piVar28) && (src < local_150)) {
            plVar38 = (long *)((long)local_150 + -1);
            do {
              piVar28 = (int *)((long)piVar28 + -1);
              if ((BYTE)*plVar38 != *(BYTE *)piVar28) {
                local_150 = (long *)((long)plVar38 + 1);
                goto LAB_00484bb7;
              }
              pBVar50 = pBVar50 + 1;
              local_150 = (long *)((long)plVar38 + -1);
            } while ((piVar46 < piVar28) && (bVar18 = src < plVar38, plVar38 = local_150, bVar18));
LAB_00484689:
            local_150 = (long *)((long)local_150 + 1);
          }
        }
        else {
          puVar39 = puVar43;
          if (puVar43 < puVar1) {
            uVar47 = *puVar43 ^ *puVar42;
            uVar45 = 0;
            if (uVar47 != 0) {
              for (; (uVar47 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
              }
            }
            pBVar50 = (BYTE *)(uVar45 >> 3 & 0x1fffffff);
            if (*puVar42 == *puVar43) {
              puVar39 = (ulong *)((long)local_150 + 0xc);
              puVar42 = (ulong *)(piVar28 + 3);
              do {
                if (puVar1 <= puVar39) goto LAB_00484b0f;
                uVar45 = *puVar42;
                uVar47 = *puVar39;
                uVar48 = uVar47 ^ uVar45;
                uVar19 = 0;
                if (uVar48 != 0) {
                  for (; (uVar48 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                  }
                }
                pBVar50 = (BYTE *)((long)puVar39 + ((uVar19 >> 3 & 0x1fffffff) - (long)puVar43));
                puVar39 = puVar39 + 1;
                puVar42 = puVar42 + 1;
              } while (uVar45 == uVar47);
            }
          }
          else {
LAB_00484b0f:
            if ((puVar39 < puVar2) && ((int)*puVar42 == (int)*puVar39)) {
              puVar39 = (ulong *)((long)puVar39 + 4);
              puVar42 = (ulong *)((long)puVar42 + 4);
            }
            if ((puVar39 < puVar24) && ((short)*puVar42 == (short)*puVar39)) {
              puVar39 = (ulong *)((long)puVar39 + 2);
              puVar42 = (ulong *)((long)puVar42 + 2);
            }
            if (puVar39 < iEnd) {
              puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar39));
            }
            pBVar50 = (BYTE *)((long)puVar39 - (long)puVar43);
          }
          pBVar50 = pBVar50 + 4;
          local_f8 = (BYTE *)(ulong)(uint)((int)local_150 - (int)piVar28);
          if ((iStart < piVar28) && (src < local_150)) {
            plVar38 = (long *)((long)local_150 + -1);
            do {
              piVar28 = (int *)((long)piVar28 + -1);
              if ((BYTE)*plVar38 != *(BYTE *)piVar28) goto LAB_00484bb1;
              pBVar50 = pBVar50 + 1;
              local_150 = (long *)((long)plVar38 + -1);
            } while ((iStart < piVar28) && (bVar18 = src < plVar38, plVar38 = local_150, bVar18));
            goto LAB_00484689;
          }
        }
        goto LAB_00484bb7;
      }
      uVar23 = pUVar13[(ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar33 & 0x3f)];
      iVar21 = 0;
      if ((uVar6 < uVar23) && (*(long *)(pBVar10 + uVar23) == lVar17)) {
        sVar26 = ZSTD_count_2segments
                           ((BYTE *)(local_150 + 1),(BYTE *)((long)(pBVar10 + uVar23) + 8),
                            (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
        pBVar50 = (BYTE *)(sVar26 + 8);
        local_f8 = (BYTE *)(ulong)(UVar22 - (uVar41 + uVar23));
        iVar20 = 7;
        iVar21 = 7;
        if ((uVar6 < uVar23) && (iVar21 = iVar20, src < local_150)) {
          piVar28 = (int *)(pBVar10 + ((ulong)uVar23 - 1));
          do {
            plVar38 = (long *)((long)local_150 + -1);
            if ((*(BYTE *)plVar38 != (BYTE)*piVar28) ||
               (pBVar50 = pBVar50 + 1, local_150 = plVar38, piVar28 <= piVar46)) break;
            piVar28 = (int *)((long)piVar28 + -1);
          } while (src < plVar38);
        }
      }
      if (iVar21 == 7) goto LAB_00484bb7;
      plVar30 = local_150;
      if (iVar21 == 0) goto LAB_004846bc;
      goto LAB_00484e51;
    }
  }
  else if (uVar7 == 7) {
    if (local_150 < plVar4) {
      bVar31 = 0x40 - (char)(ms->cParams).hashLog;
      bVar32 = 0x40 - (char)(ms->cParams).chainLog;
      bVar33 = 0x40 - (char)(pZVar9->cParams).hashLog;
      uVar7 = (pZVar9->cParams).chainLog;
      puVar1 = (ulong *)((long)iEnd - 7);
      puVar2 = (ulong *)((long)iEnd - 3);
      puVar24 = (ulong *)((long)iEnd + -1);
      ppsVar25 = &seqStore->sequences;
      pBVar3 = pBVar8 + -1;
      local_108 = pBVar3;
      do {
        lVar15 = *local_150;
        uVar45 = (ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar31 & 0x3f);
        uVar47 = (ulong)(lVar15 * -0x30e44323405a9d00) >> (bVar32 & 0x3f);
        uVar51 = (long)local_150 - (long)pBVar8;
        uVar23 = pUVar11[uVar45];
        UVar22 = (U32)uVar51;
        UVar34 = UVar22 + 1;
        uVar35 = UVar34 - local_134;
        piVar28 = (int *)(pBVar8 + uVar35);
        if (uVar35 < uVar5) {
          piVar28 = (int *)(pBVar10 + (uVar35 - uVar41));
        }
        uVar36 = pUVar12[uVar47];
        pUVar12[uVar47] = UVar22;
        pUVar11[uVar45] = UVar22;
        if ((uVar35 - uVar5 < 0xfffffffd) && (*piVar28 == *(int *)((long)local_150 + 1))) {
          plVar38 = (long *)((long)local_150 + 1);
          puVar43 = iEnd;
          if (uVar35 < uVar5) {
            puVar43 = mEnd;
          }
          sVar26 = ZSTD_count_2segments
                             ((BYTE *)((long)local_150 + 5),(BYTE *)(piVar28 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar43,(BYTE *)iStart);
          uVar45 = (long)plVar38 - (long)src;
          plVar40 = (long *)seqStore->lit;
          plVar30 = (long *)((long)plVar40 + uVar45);
          do {
            *plVar40 = *src;
            plVar40 = plVar40 + 1;
            src = (void *)((long)src + 8);
          } while (plVar40 < plVar30);
          seqStore->lit = seqStore->lit + uVar45;
          if (0xffff < uVar45) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          unaff_R15 = (BYTE *)(sVar26 + 4);
          pBVar27 = (BYTE *)(sVar26 + 1);
          psVar16 = *ppsVar25;
          psVar16->litLength = (U16)uVar45;
          psVar16->offset = 1;
          UVar34 = local_134;
joined_r0x00483f69:
          local_134 = UVar34;
          if ((BYTE *)0xffff < pBVar27) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar16->matchLength = (U16)pBVar27;
          *ppsVar25 = psVar16 + 1;
          src = (void *)((long)plVar38 + (long)unaff_R15);
          local_150 = (long *)src;
          if (src <= plVar4) {
            lVar15 = *(long *)(pBVar8 + (uVar51 & 0xffffffff) + 2);
            pUVar12[(ulong)(lVar15 * -0x30e44323405a9d00) >> (bVar32 & 0x3f)] = UVar22 + 2;
            pUVar11[(ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar31 & 0x3f)] = UVar22 + 2;
            lVar15 = *(long *)((long)src + -2);
            UVar22 = ((int)src + -2) - iVar49;
            pUVar12[(ulong)(lVar15 * -0x30e44323405a9d00) >> (bVar32 & 0x3f)] = UVar22;
            pUVar11[(ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar31 & 0x3f)] = UVar22;
            do {
              local_150 = (long *)src;
              if (plVar4 < src) break;
              UVar22 = (int)src - iVar49;
              uVar23 = UVar22 - local_10c;
              pBVar27 = pBVar8;
              if (uVar23 < uVar5) {
                pBVar27 = pBVar10 + -(long)pBVar50;
              }
              if ((uVar23 - uVar5 < 0xfffffffd) && (*(int *)(pBVar27 + uVar23) == (int)*src)) {
                puVar43 = iEnd;
                if (uVar23 < uVar5) {
                  puVar43 = mEnd;
                }
                sVar26 = ZSTD_count_2segments
                                   ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar27 + uVar23) + 4),
                                    (BYTE *)iEnd,(BYTE *)puVar43,(BYTE *)iStart);
                *(long *)seqStore->lit = *src;
                psVar16 = seqStore->sequences;
                psVar16->litLength = 0;
                psVar16->offset = 1;
                if (0xffff < sVar26 + 1) {
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar16->matchLength = (U16)(sVar26 + 1);
                seqStore->sequences = psVar16 + 1;
                lVar15 = *src;
                pUVar12[(ulong)(lVar15 * -0x30e44323405a9d00) >> (bVar32 & 0x3f)] = UVar22;
                pUVar11[(ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar31 & 0x3f)] = UVar22;
                src = (void *)((long)src + sVar26 + 4);
                bVar18 = true;
                UVar22 = local_134;
                local_134 = local_10c;
              }
              else {
                bVar18 = false;
                UVar22 = local_10c;
              }
              local_10c = UVar22;
              local_150 = (long *)src;
            } while (bVar18);
          }
        }
        else {
          if (uVar5 < uVar23) {
            plVar38 = (long *)(pBVar8 + uVar23);
            if (*plVar38 == lVar15) {
              puVar39 = (ulong *)(local_150 + 1);
              puVar43 = (ulong *)(plVar38 + 1);
              puVar42 = puVar39;
              if (puVar39 < puVar1) {
                uVar47 = *puVar39 ^ *puVar43;
                uVar45 = 0;
                if (uVar47 != 0) {
                  for (; (uVar47 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                  }
                }
                pBVar27 = (BYTE *)(uVar45 >> 3 & 0x1fffffff);
                if (*puVar43 == *puVar39) {
                  puVar42 = (ulong *)(local_150 + 2);
                  puVar43 = (ulong *)(plVar38 + 2);
                  do {
                    if (puVar1 <= puVar42) goto LAB_004838b1;
                    uVar45 = *puVar43;
                    uVar47 = *puVar42;
                    uVar48 = uVar47 ^ uVar45;
                    uVar19 = 0;
                    if (uVar48 != 0) {
                      for (; (uVar48 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                      }
                    }
                    pBVar27 = (BYTE *)((long)puVar42 + ((uVar19 >> 3 & 0x1fffffff) - (long)puVar39))
                    ;
                    puVar42 = puVar42 + 1;
                    puVar43 = puVar43 + 1;
                  } while (uVar45 == uVar47);
                }
              }
              else {
LAB_004838b1:
                if ((puVar42 < puVar2) && ((int)*puVar43 == (int)*puVar42)) {
                  puVar42 = (ulong *)((long)puVar42 + 4);
                  puVar43 = (ulong *)((long)puVar43 + 4);
                }
                if ((puVar42 < puVar24) && ((short)*puVar43 == (short)*puVar42)) {
                  puVar42 = (ulong *)((long)puVar42 + 2);
                  puVar43 = (ulong *)((long)puVar43 + 2);
                }
                if (puVar42 < iEnd) {
                  puVar42 = (ulong *)((long)puVar42 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar42));
                }
                pBVar27 = (BYTE *)((long)puVar42 - (long)puVar39);
              }
              unaff_R15 = pBVar27 + 8;
              local_108 = (BYTE *)(ulong)(uint)((int)local_150 - (int)plVar38);
              if ((uVar23 <= uVar5) || (local_150 <= src)) goto LAB_00483ee2;
              piVar28 = (int *)(pBVar3 + uVar23);
              local_150 = (long *)((long)local_150 + -1);
              while (plVar38 = local_150, (BYTE)*local_150 == (BYTE)*piVar28) {
                unaff_R15 = unaff_R15 + 1;
                plVar38 = (long *)((long)local_150 + -1);
                if ((piVar28 <= iStart) ||
                   (piVar28 = (int *)((long)piVar28 + -1), bVar18 = local_150 <= src,
                   local_150 = plVar38, bVar18)) break;
              }
              goto LAB_00483edf;
            }
LAB_004839a4:
            if (uVar5 < uVar36) {
              piVar28 = (int *)(pBVar8 + uVar36);
              if (*piVar28 != (int)*local_150) {
LAB_00483a00:
                local_150 = (long *)((long)local_150 + ((long)local_150 - (long)src >> 8) + 1);
                goto LAB_0048417c;
              }
            }
            else {
              uVar36 = pUVar14[(ulong)(lVar15 * -0x30e44323405a9d00) >> (0x40U - (char)uVar7 & 0x3f)
                              ];
              piVar28 = (int *)(pBVar10 + uVar36);
              if ((uVar36 <= uVar6) || (iVar21 = 10, *piVar28 != (int)*local_150)) {
                iVar21 = 0;
              }
              if (iVar21 != 10) {
                if (iVar21 != 0) goto LAB_0048417c;
                goto LAB_00483a00;
              }
              uVar36 = uVar41 + uVar36;
            }
            lVar15 = *(long *)((long)local_150 + 1);
            uVar45 = (ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar31 & 0x3f);
            plVar38 = (long *)((long)local_150 + 1);
            uVar23 = pUVar11[uVar45];
            pUVar11[uVar45] = UVar34;
            if (uVar5 < uVar23) {
              plVar30 = (long *)(pBVar8 + uVar23);
              if (*plVar30 == lVar15) {
                puVar39 = (ulong *)((long)local_150 + 9);
                puVar43 = (ulong *)(plVar30 + 1);
                puVar42 = puVar39;
                if (puVar39 < puVar1) {
                  uVar47 = *puVar39 ^ *puVar43;
                  uVar45 = 0;
                  if (uVar47 != 0) {
                    for (; (uVar47 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                    }
                  }
                  pBVar27 = (BYTE *)(uVar45 >> 3 & 0x1fffffff);
                  if (*puVar43 == *puVar39) {
                    puVar42 = (ulong *)((long)local_150 + 0x11);
                    puVar43 = (ulong *)(plVar30 + 2);
                    do {
                      if (puVar1 <= puVar42) goto LAB_00483d6c;
                      uVar45 = *puVar43;
                      uVar47 = *puVar42;
                      uVar48 = uVar47 ^ uVar45;
                      uVar19 = 0;
                      if (uVar48 != 0) {
                        for (; (uVar48 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                        }
                      }
                      pBVar27 = (BYTE *)((long)puVar42 +
                                        ((uVar19 >> 3 & 0x1fffffff) - (long)puVar39));
                      puVar42 = puVar42 + 1;
                      puVar43 = puVar43 + 1;
                    } while (uVar45 == uVar47);
                  }
                }
                else {
LAB_00483d6c:
                  if ((puVar42 < puVar2) && ((int)*puVar43 == (int)*puVar42)) {
                    puVar42 = (ulong *)((long)puVar42 + 4);
                    puVar43 = (ulong *)((long)puVar43 + 4);
                  }
                  if ((puVar42 < puVar24) && ((short)*puVar43 == (short)*puVar42)) {
                    puVar42 = (ulong *)((long)puVar42 + 2);
                    puVar43 = (ulong *)((long)puVar43 + 2);
                  }
                  if (puVar42 < iEnd) {
                    puVar42 = (ulong *)((long)puVar42 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar42));
                  }
                  pBVar27 = (BYTE *)((long)puVar42 - (long)puVar39);
                }
                unaff_R15 = pBVar27 + 8;
                uVar35 = (int)plVar38 - (int)plVar30;
                iVar21 = 7;
                if ((uVar5 < uVar23) && (src < plVar38)) {
                  piVar29 = (int *)(pBVar3 + uVar23);
                  plVar30 = local_150;
                  while (local_150 = plVar30, (BYTE)*local_150 == (BYTE)*piVar29) {
                    unaff_R15 = unaff_R15 + 1;
                    plVar38 = local_150;
                    if ((piVar29 <= iStart) ||
                       (piVar29 = (int *)((long)piVar29 + -1),
                       plVar30 = (long *)((long)local_150 + -1), local_150 <= src))
                    goto LAB_00483c0b;
                  }
                  plVar38 = (long *)((long)local_150 + 1);
                }
              }
              else {
LAB_00483bfa:
                iVar21 = 0;
                uVar35 = (uint)local_108;
                plVar38 = local_150;
              }
            }
            else {
              uVar23 = pUVar13[(ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar33 & 0x3f)];
              if ((uVar23 <= uVar6) || (*(long *)(pBVar10 + uVar23) != lVar15)) goto LAB_00483bfa;
              sVar26 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_150 + 9),
                                  (BYTE *)((long)(pBVar10 + uVar23) + 8),(BYTE *)iEnd,(BYTE *)mEnd,
                                  (BYTE *)iStart);
              unaff_R15 = (BYTE *)(sVar26 + 8);
              uVar35 = UVar34 - (uVar41 + uVar23);
              iVar21 = 7;
              iVar20 = 7;
              if ((uVar6 < uVar23) && (iVar21 = iVar20, src < plVar38)) {
                piVar29 = (int *)(pBVar10 + ((ulong)uVar23 - 1));
                while ((BYTE)*local_150 == (BYTE)*piVar29) {
                  unaff_R15 = unaff_R15 + 1;
                  plVar38 = local_150;
                  if ((piVar29 <= piVar46) ||
                     (piVar29 = (int *)((long)piVar29 + -1), bVar18 = local_150 <= src,
                     local_150 = (long *)((long)local_150 + -1), bVar18)) goto LAB_00483c0b;
                }
                plVar38 = (long *)((long)local_150 + 1);
              }
            }
LAB_00483c0b:
            local_150 = plVar38;
            if (iVar21 == 7) {
              local_108 = (BYTE *)(ulong)uVar35;
              goto LAB_00483ee2;
            }
            if (iVar21 != 0) {
              local_108 = (BYTE *)(ulong)uVar35;
              goto LAB_0048417c;
            }
            puVar43 = (ulong *)((long)local_150 + 4);
            puVar42 = (ulong *)(piVar28 + 1);
            if (uVar36 < uVar5) {
              sVar26 = ZSTD_count_2segments
                                 ((BYTE *)puVar43,(BYTE *)puVar42,(BYTE *)iEnd,(BYTE *)mEnd,
                                  (BYTE *)iStart);
              unaff_R15 = (BYTE *)(sVar26 + 4);
              local_108 = (BYTE *)(ulong)(UVar22 - uVar36);
              if ((piVar46 < piVar28) && (src < local_150)) {
                local_150 = (long *)((long)local_150 + -1);
                while (piVar28 = (int *)((long)piVar28 + -1), plVar38 = local_150,
                      (BYTE)*local_150 == *(BYTE *)piVar28) {
                  unaff_R15 = unaff_R15 + 1;
                  plVar38 = (long *)((long)local_150 + -1);
                  if ((piVar28 <= piVar46) ||
                     (bVar18 = local_150 <= src, local_150 = plVar38, bVar18)) break;
                }
                goto LAB_00483edf;
              }
            }
            else {
              puVar39 = puVar43;
              if (puVar43 < puVar1) {
                uVar47 = *puVar43 ^ *puVar42;
                uVar45 = 0;
                if (uVar47 != 0) {
                  for (; (uVar47 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                  }
                }
                pBVar27 = (BYTE *)(uVar45 >> 3 & 0x1fffffff);
                if (*puVar42 == *puVar43) {
                  puVar39 = (ulong *)((long)local_150 + 0xc);
                  puVar42 = (ulong *)(piVar28 + 3);
                  do {
                    if (puVar1 <= puVar39) goto LAB_00483e2d;
                    uVar45 = *puVar42;
                    uVar47 = *puVar39;
                    uVar48 = uVar47 ^ uVar45;
                    uVar19 = 0;
                    if (uVar48 != 0) {
                      for (; (uVar48 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                      }
                    }
                    pBVar27 = (BYTE *)((long)puVar39 + ((uVar19 >> 3 & 0x1fffffff) - (long)puVar43))
                    ;
                    puVar39 = puVar39 + 1;
                    puVar42 = puVar42 + 1;
                  } while (uVar45 == uVar47);
                }
              }
              else {
LAB_00483e2d:
                if ((puVar39 < puVar2) && ((int)*puVar42 == (int)*puVar39)) {
                  puVar39 = (ulong *)((long)puVar39 + 4);
                  puVar42 = (ulong *)((long)puVar42 + 4);
                }
                if ((puVar39 < puVar24) && ((short)*puVar42 == (short)*puVar39)) {
                  puVar39 = (ulong *)((long)puVar39 + 2);
                  puVar42 = (ulong *)((long)puVar42 + 2);
                }
                if (puVar39 < iEnd) {
                  puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar39));
                }
                pBVar27 = (BYTE *)((long)puVar39 - (long)puVar43);
              }
              unaff_R15 = pBVar27 + 4;
              local_108 = (BYTE *)(ulong)(uint)((int)local_150 - (int)piVar28);
              if ((iStart < piVar28) && (src < local_150)) {
                local_150 = (long *)((long)local_150 + -1);
                while (piVar28 = (int *)((long)piVar28 + -1), plVar38 = local_150,
                      (BYTE)*local_150 == *(BYTE *)piVar28) {
                  unaff_R15 = unaff_R15 + 1;
                  plVar38 = (long *)((long)local_150 + -1);
                  if ((piVar28 <= iStart) ||
                     (bVar18 = local_150 <= src, local_150 = plVar38, bVar18)) break;
                }
LAB_00483edf:
                local_150 = (long *)((long)plVar38 + 1);
              }
            }
LAB_00483ee2:
            uVar45 = (long)local_150 - (long)src;
            plVar30 = (long *)seqStore->lit;
            plVar38 = (long *)((long)plVar30 + uVar45);
            do {
              *plVar30 = *src;
              plVar30 = plVar30 + 1;
              src = (void *)((long)src + 8);
            } while (plVar30 < plVar38);
            seqStore->lit = seqStore->lit + uVar45;
            if (0xffff < uVar45) {
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            pBVar27 = unaff_R15 + -3;
            psVar16 = *ppsVar25;
            psVar16->litLength = (U16)uVar45;
            psVar16->offset = (U32)local_108 + 3;
            plVar38 = local_150;
            UVar34 = (U32)local_108;
            local_10c = local_134;
            goto joined_r0x00483f69;
          }
          uVar23 = pUVar13[(ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar33 & 0x3f)];
          iVar21 = 0;
          if ((uVar6 < uVar23) && (*(long *)(pBVar10 + uVar23) == lVar15)) {
            sVar26 = ZSTD_count_2segments
                               ((BYTE *)(local_150 + 1),(BYTE *)((long)(pBVar10 + uVar23) + 8),
                                (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
            unaff_R15 = (BYTE *)(sVar26 + 8);
            local_108 = (BYTE *)(ulong)(UVar22 - (uVar41 + uVar23));
            iVar20 = 7;
            iVar21 = 7;
            if ((uVar6 < uVar23) && (iVar21 = iVar20, src < local_150)) {
              piVar28 = (int *)(pBVar10 + ((ulong)uVar23 - 1));
              do {
                plVar38 = (long *)((long)local_150 + -1);
                if ((*(BYTE *)plVar38 != (BYTE)*piVar28) ||
                   (unaff_R15 = unaff_R15 + 1, local_150 = plVar38, piVar28 <= piVar46)) break;
                piVar28 = (int *)((long)piVar28 + -1);
              } while (src < plVar38);
            }
          }
          if (iVar21 == 7) goto LAB_00483ee2;
          if (iVar21 == 0) goto LAB_004839a4;
        }
LAB_0048417c:
      } while (local_150 < plVar4);
    }
  }
  else if (local_150 < plVar4) {
    bVar31 = 0x40 - (char)(ms->cParams).hashLog;
    bVar32 = 0x20 - (char)(ms->cParams).chainLog;
    bVar33 = 0x40 - (char)(pZVar9->cParams).hashLog;
    uVar7 = (pZVar9->cParams).chainLog;
    puVar1 = (ulong *)((long)iEnd + -7);
    puVar2 = (ulong *)((long)iEnd + -3);
    puVar24 = (ulong *)((long)iEnd + -1);
    ppsVar25 = &seqStore->sequences;
    pBVar3 = pBVar8 + -1;
    local_f0 = pBVar3;
    do {
      lVar15 = *local_150;
      uVar47 = (ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar31 & 0x3f);
      uVar36 = (int)*local_150 * -0x61c8864f;
      uVar44 = uVar36 >> (bVar32 & 0x1f);
      uVar45 = (long)local_150 - (long)pBVar8;
      uVar23 = pUVar11[uVar47];
      UVar22 = (U32)uVar45;
      UVar34 = UVar22 + 1;
      uVar35 = UVar34 - local_134;
      piVar28 = (int *)(pBVar8 + uVar35);
      if (uVar35 < uVar5) {
        piVar28 = (int *)(pBVar10 + (uVar35 - uVar41));
      }
      uVar37 = pUVar12[uVar44];
      pUVar12[uVar44] = UVar22;
      pUVar11[uVar47] = UVar22;
      if ((uVar35 - uVar5 < 0xfffffffd) && (*piVar28 == *(int *)((long)local_150 + 1))) {
        plVar38 = (long *)((long)local_150 + 1);
        puVar43 = iEnd;
        if (uVar35 < uVar5) {
          puVar43 = mEnd;
        }
        sVar26 = ZSTD_count_2segments
                           ((BYTE *)((long)local_150 + 5),(BYTE *)(piVar28 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar43,(BYTE *)iStart);
        uVar47 = (long)plVar38 - (long)src;
        plVar40 = (long *)seqStore->lit;
        plVar30 = (long *)((long)plVar40 + uVar47);
        do {
          *plVar40 = *src;
          plVar40 = plVar40 + 1;
          src = (void *)((long)src + 8);
        } while (plVar40 < plVar30);
        seqStore->lit = seqStore->lit + uVar47;
        if (0xffff < uVar47) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        local_128 = (BYTE *)(sVar26 + 4);
        pBVar27 = (BYTE *)(sVar26 + 1);
        psVar16 = *ppsVar25;
        psVar16->litLength = (U16)uVar47;
        psVar16->offset = 1;
        UVar34 = local_134;
joined_r0x0048658f:
        local_134 = UVar34;
        if ((BYTE *)0xffff < pBVar27) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar16->matchLength = (U16)pBVar27;
        *ppsVar25 = psVar16 + 1;
        src = (void *)((long)plVar38 + (long)local_128);
        local_150 = (long *)src;
        if (src <= plVar4) {
          uVar45 = uVar45 & 0xffffffff;
          pUVar12[(uint)(*(int *)(pBVar8 + uVar45 + 2) * -0x61c8864f) >> (bVar32 & 0x1f)] =
               UVar22 + 2;
          pUVar11[(ulong)(*(long *)(pBVar8 + uVar45 + 2) * -0x30e44323485a9b9d) >> (bVar31 & 0x3f)]
               = UVar22 + 2;
          UVar22 = ((int)src + -2) - iVar49;
          pUVar12[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar32 & 0x1f)] = UVar22;
          pUVar11[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar31 & 0x3f)] =
               UVar22;
          do {
            local_150 = (long *)src;
            if (plVar4 < src) break;
            UVar22 = (int)src - iVar49;
            uVar23 = UVar22 - local_10c;
            pBVar27 = pBVar8;
            if (uVar23 < uVar5) {
              pBVar27 = pBVar10 + -(long)pBVar50;
            }
            if ((uVar23 - uVar5 < 0xfffffffd) && (*(int *)(pBVar27 + uVar23) == (int)*src)) {
              puVar43 = iEnd;
              if (uVar23 < uVar5) {
                puVar43 = mEnd;
              }
              sVar26 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar27 + uVar23) + 4),
                                  (BYTE *)iEnd,(BYTE *)puVar43,(BYTE *)iStart);
              *(long *)seqStore->lit = *src;
              psVar16 = seqStore->sequences;
              psVar16->litLength = 0;
              psVar16->offset = 1;
              if (0xffff < sVar26 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar16->matchLength = (U16)(sVar26 + 1);
              seqStore->sequences = psVar16 + 1;
              pUVar12[(uint)((int)*src * -0x61c8864f) >> (bVar32 & 0x1f)] = UVar22;
              pUVar11[(ulong)(*src * -0x30e44323485a9b9d) >> (bVar31 & 0x3f)] = UVar22;
              src = (void *)((long)src + sVar26 + 4);
              bVar18 = true;
              UVar22 = local_134;
              local_134 = local_10c;
            }
            else {
              bVar18 = false;
              UVar22 = local_10c;
            }
            local_10c = UVar22;
            local_150 = (long *)src;
          } while (bVar18);
        }
      }
      else {
        if (uVar5 < uVar23) {
          plVar38 = (long *)(pBVar8 + uVar23);
          if (*plVar38 == *local_150) {
            puVar39 = (ulong *)(local_150 + 1);
            puVar43 = (ulong *)(plVar38 + 1);
            puVar42 = puVar39;
            if (puVar39 < puVar1) {
              uVar51 = *puVar39 ^ *puVar43;
              uVar47 = 0;
              if (uVar51 != 0) {
                for (; (uVar51 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                }
              }
              pBVar27 = (BYTE *)(uVar47 >> 3 & 0x1fffffff);
              if (*puVar43 == *puVar39) {
                puVar42 = (ulong *)(local_150 + 2);
                puVar43 = (ulong *)(plVar38 + 2);
                do {
                  if (puVar1 <= puVar42) goto LAB_00485fde;
                  uVar47 = *puVar43;
                  uVar51 = *puVar42;
                  uVar48 = uVar51 ^ uVar47;
                  uVar19 = 0;
                  if (uVar48 != 0) {
                    for (; (uVar48 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  pBVar27 = (BYTE *)((long)puVar42 + ((uVar19 >> 3 & 0x1fffffff) - (long)puVar39));
                  puVar42 = puVar42 + 1;
                  puVar43 = puVar43 + 1;
                } while (uVar47 == uVar51);
              }
            }
            else {
LAB_00485fde:
              if ((puVar42 < puVar2) && ((int)*puVar43 == (int)*puVar42)) {
                puVar42 = (ulong *)((long)puVar42 + 4);
                puVar43 = (ulong *)((long)puVar43 + 4);
              }
              if ((puVar42 < puVar24) && ((short)*puVar43 == (short)*puVar42)) {
                puVar42 = (ulong *)((long)puVar42 + 2);
                puVar43 = (ulong *)((long)puVar43 + 2);
              }
              if (puVar42 < iEnd) {
                puVar42 = (ulong *)((long)puVar42 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar42));
              }
              pBVar27 = (BYTE *)((long)puVar42 - (long)puVar39);
            }
            local_128 = pBVar27 + 8;
            local_f0 = (BYTE *)(ulong)(uint)((int)local_150 - (int)plVar38);
            if ((uVar23 <= uVar5) || (local_150 <= src)) goto LAB_00486508;
            piVar28 = (int *)(pBVar3 + uVar23);
            local_150 = (long *)((long)local_150 + -1);
            while (plVar38 = local_150, (BYTE)*local_150 == (BYTE)*piVar28) {
              local_128 = local_128 + 1;
              plVar38 = (long *)((long)local_150 + -1);
              if ((piVar28 <= iStart) ||
                 (piVar28 = (int *)((long)piVar28 + -1), bVar18 = local_150 <= src,
                 local_150 = plVar38, bVar18)) break;
            }
            goto LAB_004860a3;
          }
LAB_004860d5:
          if (uVar5 < uVar37) {
            piVar28 = (int *)(pBVar8 + uVar37);
            if (*piVar28 != (int)*local_150) {
LAB_00486132:
              local_150 = (long *)((long)local_150 + ((long)local_150 - (long)src >> 8) + 1);
              goto LAB_00486794;
            }
          }
          else {
            uVar37 = pUVar14[uVar36 >> (0x20U - (char)uVar7 & 0x1f)];
            piVar28 = (int *)(pBVar10 + uVar37);
            if ((uVar37 <= uVar6) || (iVar21 = 10, *piVar28 != (int)*local_150)) {
              iVar21 = 0;
            }
            if (iVar21 != 10) {
              if (iVar21 != 0) goto LAB_00486794;
              goto LAB_00486132;
            }
            uVar37 = uVar41 + uVar37;
          }
          lVar15 = *(long *)((long)local_150 + 1);
          uVar47 = (ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar31 & 0x3f);
          plVar38 = (long *)((long)local_150 + 1);
          uVar23 = pUVar11[uVar47];
          pUVar11[uVar47] = UVar34;
          uVar35 = (uint)local_f0;
          plVar30 = local_150;
          if (uVar5 < uVar23) {
            plVar40 = (long *)(pBVar8 + uVar23);
            iVar21 = 0;
            if (*plVar40 == lVar15) {
              puVar39 = (ulong *)((long)local_150 + 9);
              puVar43 = (ulong *)(plVar40 + 1);
              puVar42 = puVar39;
              if (puVar39 < puVar1) {
                uVar51 = *puVar39 ^ *puVar43;
                uVar47 = 0;
                if (uVar51 != 0) {
                  for (; (uVar51 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                  }
                }
                pBVar27 = (BYTE *)(uVar47 >> 3 & 0x1fffffff);
                if (*puVar43 == *puVar39) {
                  puVar42 = (ulong *)((long)local_150 + 0x11);
                  puVar43 = (ulong *)(plVar40 + 2);
                  do {
                    if (puVar1 <= puVar42) goto LAB_0048636e;
                    uVar47 = *puVar43;
                    uVar51 = *puVar42;
                    uVar48 = uVar51 ^ uVar47;
                    uVar19 = 0;
                    if (uVar48 != 0) {
                      for (; (uVar48 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                      }
                    }
                    pBVar27 = (BYTE *)((long)puVar42 + ((uVar19 >> 3 & 0x1fffffff) - (long)puVar39))
                    ;
                    puVar42 = puVar42 + 1;
                    puVar43 = puVar43 + 1;
                  } while (uVar47 == uVar51);
                }
              }
              else {
LAB_0048636e:
                if ((puVar42 < puVar2) && ((int)*puVar43 == (int)*puVar42)) {
                  puVar42 = (ulong *)((long)puVar42 + 4);
                  puVar43 = (ulong *)((long)puVar43 + 4);
                }
                if ((puVar42 < puVar24) && ((short)*puVar43 == (short)*puVar42)) {
                  puVar42 = (ulong *)((long)puVar42 + 2);
                  puVar43 = (ulong *)((long)puVar43 + 2);
                }
                if (puVar42 < iEnd) {
                  puVar42 = (ulong *)((long)puVar42 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar42));
                }
                pBVar27 = (BYTE *)((long)puVar42 - (long)puVar39);
              }
              local_128 = pBVar27 + 8;
              uVar35 = (int)plVar38 - (int)plVar40;
              iVar21 = 7;
              plVar30 = plVar38;
              if ((uVar5 < uVar23) && (src < plVar38)) {
                piVar29 = (int *)(pBVar3 + uVar23);
                plVar38 = local_150;
                while (local_150 = plVar38, (BYTE)*local_150 == (BYTE)*piVar29) {
                  local_128 = local_128 + 1;
                  plVar30 = local_150;
                  if ((piVar29 <= iStart) ||
                     (piVar29 = (int *)((long)piVar29 + -1),
                     plVar38 = (long *)((long)local_150 + -1), local_150 <= src)) goto LAB_0048642a;
                }
                plVar30 = (long *)((long)local_150 + 1);
              }
            }
          }
          else {
            uVar23 = pUVar13[(ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar33 & 0x3f)];
            iVar21 = 0;
            if ((uVar6 < uVar23) && (*(long *)(pBVar10 + uVar23) == lVar15)) {
              sVar26 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_150 + 9),
                                  (BYTE *)((long)(pBVar10 + uVar23) + 8),(BYTE *)iEnd,(BYTE *)mEnd,
                                  (BYTE *)iStart);
              local_128 = (BYTE *)(sVar26 + 8);
              uVar35 = UVar34 - (uVar41 + uVar23);
              iVar20 = 7;
              iVar21 = 7;
              plVar30 = plVar38;
              if ((uVar6 < uVar23) && (iVar21 = iVar20, src < plVar38)) {
                piVar29 = (int *)(pBVar10 + ((ulong)uVar23 - 1));
                plVar38 = local_150;
                while (local_150 = plVar38, (BYTE)*local_150 == (BYTE)*piVar29) {
                  local_128 = local_128 + 1;
                  plVar30 = local_150;
                  if ((piVar29 <= piVar46) ||
                     (piVar29 = (int *)((long)piVar29 + -1),
                     plVar38 = (long *)((long)local_150 + -1), local_150 <= src)) goto LAB_0048642a;
                }
                plVar30 = (long *)((long)local_150 + 1);
              }
            }
          }
LAB_0048642a:
          local_150 = plVar30;
          if (iVar21 == 7) {
            local_f0 = (BYTE *)(ulong)uVar35;
            goto LAB_00486508;
          }
          if (iVar21 != 0) {
            local_f0 = (BYTE *)(ulong)uVar35;
            goto LAB_00486794;
          }
          puVar43 = (ulong *)((long)local_150 + 4);
          puVar42 = (ulong *)(piVar28 + 1);
          if (uVar37 < uVar5) {
            sVar26 = ZSTD_count_2segments
                               ((BYTE *)puVar43,(BYTE *)puVar42,(BYTE *)iEnd,(BYTE *)mEnd,
                                (BYTE *)iStart);
            local_128 = (BYTE *)(sVar26 + 4);
            local_f0 = (BYTE *)(ulong)(UVar22 - uVar37);
            if ((piVar46 < piVar28) && (src < local_150)) {
              local_150 = (long *)((long)local_150 + -1);
              while (piVar28 = (int *)((long)piVar28 + -1), plVar38 = local_150,
                    (BYTE)*local_150 == *(BYTE *)piVar28) {
                local_128 = local_128 + 1;
                plVar38 = (long *)((long)local_150 + -1);
                if ((piVar28 <= piVar46) || (bVar18 = local_150 <= src, local_150 = plVar38, bVar18)
                   ) break;
              }
              goto LAB_004860a3;
            }
          }
          else {
            puVar39 = puVar43;
            if (puVar43 < puVar1) {
              uVar51 = *puVar43 ^ *puVar42;
              uVar47 = 0;
              if (uVar51 != 0) {
                for (; (uVar51 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                }
              }
              pBVar27 = (BYTE *)(uVar47 >> 3 & 0x1fffffff);
              if (*puVar42 == *puVar43) {
                puVar39 = (ulong *)((long)local_150 + 0xc);
                puVar42 = (ulong *)(piVar28 + 3);
                do {
                  if (puVar1 <= puVar39) goto LAB_00486823;
                  uVar47 = *puVar42;
                  uVar51 = *puVar39;
                  uVar48 = uVar51 ^ uVar47;
                  uVar19 = 0;
                  if (uVar48 != 0) {
                    for (; (uVar48 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                    }
                  }
                  pBVar27 = (BYTE *)((long)puVar39 + ((uVar19 >> 3 & 0x1fffffff) - (long)puVar43));
                  puVar39 = puVar39 + 1;
                  puVar42 = puVar42 + 1;
                } while (uVar47 == uVar51);
              }
            }
            else {
LAB_00486823:
              if ((puVar39 < puVar2) && ((int)*puVar42 == (int)*puVar39)) {
                puVar39 = (ulong *)((long)puVar39 + 4);
                puVar42 = (ulong *)((long)puVar42 + 4);
              }
              if ((puVar39 < puVar24) && ((short)*puVar42 == (short)*puVar39)) {
                puVar39 = (ulong *)((long)puVar39 + 2);
                puVar42 = (ulong *)((long)puVar42 + 2);
              }
              if (puVar39 < iEnd) {
                puVar39 = (ulong *)((long)puVar39 + (ulong)((BYTE)*puVar42 == (BYTE)*puVar39));
              }
              pBVar27 = (BYTE *)((long)puVar39 - (long)puVar43);
            }
            local_128 = pBVar27 + 4;
            local_f0 = (BYTE *)(ulong)(uint)((int)local_150 - (int)piVar28);
            if ((iStart < piVar28) && (src < local_150)) {
              local_150 = (long *)((long)local_150 + -1);
              while (piVar28 = (int *)((long)piVar28 + -1), plVar38 = local_150,
                    (BYTE)*local_150 == *(BYTE *)piVar28) {
                local_128 = local_128 + 1;
                plVar38 = (long *)((long)local_150 + -1);
                if ((piVar28 <= iStart) || (bVar18 = local_150 <= src, local_150 = plVar38, bVar18))
                break;
              }
LAB_004860a3:
              local_150 = (long *)((long)plVar38 + 1);
            }
          }
LAB_00486508:
          uVar47 = (long)local_150 - (long)src;
          plVar30 = (long *)seqStore->lit;
          plVar38 = (long *)((long)plVar30 + uVar47);
          do {
            *plVar30 = *src;
            plVar30 = plVar30 + 1;
            src = (void *)((long)src + 8);
          } while (plVar30 < plVar38);
          seqStore->lit = seqStore->lit + uVar47;
          if (0xffff < uVar47) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          pBVar27 = local_128 + -3;
          psVar16 = *ppsVar25;
          psVar16->litLength = (U16)uVar47;
          psVar16->offset = (U32)local_f0 + 3;
          plVar38 = local_150;
          UVar34 = (U32)local_f0;
          local_10c = local_134;
          goto joined_r0x0048658f;
        }
        uVar23 = pUVar13[(ulong)(lVar15 * -0x30e44323485a9b9d) >> (bVar33 & 0x3f)];
        iVar21 = 0;
        if ((uVar6 < uVar23) && (iVar21 = 0, *(long *)(pBVar10 + uVar23) == *local_150)) {
          sVar26 = ZSTD_count_2segments
                             ((BYTE *)(local_150 + 1),(BYTE *)((long)(pBVar10 + uVar23) + 8),
                              (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
          local_128 = (BYTE *)(sVar26 + 8);
          local_f0 = (BYTE *)(ulong)(UVar22 - (uVar41 + uVar23));
          iVar21 = 7;
          if ((uVar6 < uVar23) && (src < local_150)) {
            piVar28 = (int *)(pBVar10 + ((ulong)uVar23 - 1));
            do {
              plVar38 = (long *)((long)local_150 + -1);
              if ((*(BYTE *)plVar38 != (BYTE)*piVar28) ||
                 (local_128 = local_128 + 1, local_150 = plVar38, piVar28 <= piVar46)) break;
              piVar28 = (int *)((long)piVar28 + -1);
            } while (src < plVar38);
          }
        }
        if (iVar21 == 7) goto LAB_00486508;
        if (iVar21 == 0) goto LAB_004860d5;
      }
LAB_00486794:
    } while (local_150 < plVar4);
  }
LAB_0048694d:
  *rep = local_134;
  rep[1] = local_10c;
  return (long)iEnd - (long)src;
LAB_00484bb1:
  local_150 = (long *)((long)plVar38 + 1);
LAB_00484bb7:
  uVar45 = (long)local_150 - (long)src;
  plVar30 = (long *)seqStore->lit;
  plVar38 = (long *)((long)plVar30 + uVar45);
  do {
    *plVar30 = *src;
    plVar30 = plVar30 + 1;
    src = (void *)((long)src + 8);
  } while (plVar30 < plVar38);
  seqStore->lit = seqStore->lit + uVar45;
  if (0xffff < uVar45) {
    seqStore->longLengthID = 1;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  pBVar27 = pBVar50 + -3;
  psVar16 = *ppsVar25;
  psVar16->litLength = (U16)uVar45;
  psVar16->offset = (U32)local_f8 + 3;
  UVar34 = (U32)local_f8;
  local_10c = local_134;
joined_r0x00484440:
  local_134 = UVar34;
  if ((BYTE *)0xffff < pBVar27) {
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
  }
  psVar16->matchLength = (U16)pBVar27;
  *ppsVar25 = psVar16 + 1;
  src = (void *)((long)local_150 + (long)pBVar50);
  local_150 = (long *)src;
  if (src <= plVar4) {
    lVar17 = *(long *)(pBVar8 + (uVar51 & 0xffffffff) + 2);
    pUVar12[(ulong)(lVar17 * -0x30e4432340650000) >> (bVar32 & 0x3f)] = UVar22 + 2;
    pUVar11[(ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar31 & 0x3f)] = UVar22 + 2;
    lVar17 = *(long *)((long)src + -2);
    UVar22 = ((int)src + -2) - iVar49;
    pUVar12[(ulong)(lVar17 * -0x30e4432340650000) >> (bVar32 & 0x3f)] = UVar22;
    pUVar11[(ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar31 & 0x3f)] = UVar22;
    do {
      local_150 = (long *)src;
      if (plVar4 < src) break;
      UVar22 = (int)src - iVar49;
      uVar23 = UVar22 - local_10c;
      pBVar27 = pBVar8;
      if (uVar23 < uVar5) {
        pBVar27 = pBVar10 + lVar15;
      }
      if ((uVar23 - uVar5 < 0xfffffffd) && (*(int *)(pBVar27 + uVar23) == (int)*src)) {
        puVar43 = iEnd;
        if (uVar23 < uVar5) {
          puVar43 = mEnd;
        }
        sVar26 = ZSTD_count_2segments
                           ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar27 + uVar23) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar43,(BYTE *)iStart);
        *(long *)seqStore->lit = *src;
        psVar16 = seqStore->sequences;
        psVar16->litLength = 0;
        psVar16->offset = 1;
        if (0xffff < sVar26 + 1) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar16->matchLength = (U16)(sVar26 + 1);
        seqStore->sequences = psVar16 + 1;
        lVar17 = *src;
        pUVar12[(ulong)(lVar17 * -0x30e4432340650000) >> (bVar32 & 0x3f)] = UVar22;
        pUVar11[(ulong)(lVar17 * -0x30e44323485a9b9d) >> (bVar31 & 0x3f)] = UVar22;
        src = (void *)((long)src + sVar26 + 4);
        bVar18 = true;
        UVar22 = local_134;
        local_134 = local_10c;
      }
      else {
        bVar18 = false;
        UVar22 = local_10c;
      }
      local_10c = UVar22;
      local_150 = (long *)src;
    } while (bVar18);
  }
LAB_00484e51:
  if (plVar4 <= local_150) goto LAB_0048694d;
  goto LAB_004842ac;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_dictMatchState);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_dictMatchState);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_dictMatchState);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_dictMatchState);
    }
}